

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

void __thiscall
Js::TypedArray<unsigned_int,_false,_false>::TypedArray
          (TypedArray<unsigned_int,_false,_false> *this,ArrayBufferBase *arrayBuffer,
          uint32 byteOffset,uint32 mappedLength,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  TypeId TVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  DynamicType *type_local;
  uint32 mappedLength_local;
  uint32 byteOffset_local;
  ArrayBufferBase *arrayBuffer_local;
  TypedArray<unsigned_int,_false,_false> *this_local;
  
  Js::TypedArrayBase::TypedArrayBase
            (&this->super_TypedArrayBase,arrayBuffer,byteOffset,mappedLength,4,type);
  (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_01dcfda8;
  uVar3 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  if (uVar3 < byteOffset) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/TypedArray.h"
                                ,0x25f,"(arrayBuffer->GetByteLength() >= byteOffset)",
                                "invalid offset");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar3 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar3 < (ulong)mappedLength * 4 + (ulong)byteOffset) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/TypedArray.h"
                                ,0x260,
                                "(mappedLength*sizeof(TypeName)+byteOffset <= arrayBuffer->GetByteLength())"
                                ,"invalid length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  iVar4 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
  (this->super_TypedArrayBase).buffer = (Type)(CONCAT44(extraout_var,iVar4) + (ulong)byteOffset);
  uVar3 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  uVar3 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                    (arrayBuffer,(ulong)uVar3);
  if ((((uVar3 & 1) != 0) && (byteOffset == 0)) &&
     (uVar3 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(),
     mappedLength == uVar3 >> 2)) {
    TVar5 = Js::Type::GetTypeId(&type->super_Type);
    switch(TVar5) {
    case TypeIds_Int8Array:
      VirtualTableInfo<Js::TypedArray<char,_false,_true>_>::SetVirtualTable(this);
      break;
    case TypeIds_Uint8Array:
      VirtualTableInfo<Js::TypedArray<unsigned_char,_false,_true>_>::SetVirtualTable(this);
      break;
    case TypeIds_Uint8ClampedArray:
      VirtualTableInfo<Js::TypedArray<unsigned_char,_true,_true>_>::SetVirtualTable(this);
      break;
    case TypeIds_Int16Array:
      VirtualTableInfo<Js::TypedArray<short,_false,_true>_>::SetVirtualTable(this);
      break;
    case TypeIds_Uint16Array:
      VirtualTableInfo<Js::TypedArray<unsigned_short,_false,_true>_>::SetVirtualTable(this);
      break;
    case TypeIds_Int32Array:
      VirtualTableInfo<Js::TypedArray<int,_false,_true>_>::SetVirtualTable(this);
      break;
    case TypeIds_Uint32Array:
      VirtualTableInfo<Js::TypedArray<unsigned_int,_false,_true>_>::SetVirtualTable(this);
      break;
    case TypeIds_Float32Array:
      VirtualTableInfo<Js::TypedArray<float,_false,_true>_>::SetVirtualTable(this);
      break;
    case TypeIds_Float64Array:
      VirtualTableInfo<Js::TypedArray<double,_false,_true>_>::SetVirtualTable(this);
    }
  }
  return;
}

Assistant:

TypedArray<TypeName, clamped, virtualAllocated>::TypedArray(ArrayBufferBase* arrayBuffer, uint32 byteOffset, uint32 mappedLength, DynamicType* type) :
        TypedArrayBase(arrayBuffer, byteOffset, mappedLength, sizeof(TypeName), type)
    {
        AssertMsg(arrayBuffer->GetByteLength() >= byteOffset, "invalid offset");
        AssertMsg(mappedLength*sizeof(TypeName)+byteOffset <= arrayBuffer->GetByteLength(), "invalid length");
        buffer = arrayBuffer->GetBuffer() + byteOffset;
        if (arrayBuffer->IsValidVirtualBufferLength(arrayBuffer->GetByteLength()) &&
             (byteOffset == 0) &&
             (mappedLength == (arrayBuffer->GetByteLength() / sizeof(TypeName)))
           )
        {
            // update the vtable
            switch (type->GetTypeId())
            {
            case TypeIds_Int8Array:
                VirtualTableInfo<Int8VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Uint8Array:
                VirtualTableInfo<Uint8VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Uint8ClampedArray:
                VirtualTableInfo<Uint8ClampedVirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Int16Array:
                VirtualTableInfo<Int16VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Uint16Array:
                VirtualTableInfo<Uint16VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Int32Array:
                VirtualTableInfo<Int32VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Uint32Array:
                VirtualTableInfo<Uint32VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Float32Array:
                VirtualTableInfo<Float32VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Float64Array:
                VirtualTableInfo<Float64VirtualArray>::SetVirtualTable(this);
                break;
            default:
                break;
            }
        }
    }